

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2cfb1b::PhonyCommand::getShortDescription
          (PhonyCommand *this,SmallVectorImpl<char> *result)

{
  StringRef Str;
  raw_svector_ostream local_40;
  
  llvm::raw_svector_ostream::raw_svector_ostream(&local_40,result);
  Str.Data = (this->super_ExternalCommand).super_Command.name._M_dataplus._M_p;
  Str.Length = (this->super_ExternalCommand).super_Command.name._M_string_length;
  llvm::raw_ostream::operator<<((raw_ostream *)&local_40,Str);
  llvm::raw_ostream::~raw_ostream((raw_ostream *)&local_40);
  return;
}

Assistant:

virtual void getShortDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream(result) << getName();
  }